

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_efficiency.cpp
# Opt level: O2

void run<vbytehuffzero>(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *inputs)

{
  pointer pvVar1;
  uint32_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer b;
  ostream *poVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  char *__s;
  pointer pvVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  undefined1 in_XMM2 [16];
  vector<double,_std::allocator<double>_> enc_speed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> recover;
  double decode_IPS;
  double encode_IPS;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_data;
  vector<double,_std::allocator<double>_> dec_speed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  string local_50;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"\\method{");
  vbytehuffzero::name_abi_cxx11_();
  poVar5 = std::operator<<(poVar5,(string *)&enc_speed);
  poVar5 = std::operator<<(poVar5,"}  &");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&enc_speed);
  enc_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  enc_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  enc_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dec_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dec_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dec_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar1 = (inputs->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar9 = (inputs->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar1; pvVar9 = pvVar9 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &encoded_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
               ((long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start) * 2,(allocator_type *)&tmp_buf);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&tmp_buf,((long)(pvVar9->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar9->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start) * 2,
               (allocator_type *)&recover);
    iVar10 = 5;
    sVar7 = 0;
    uVar11 = 0xffffffffffffffff;
    while (bVar12 = iVar10 != 0, iVar10 = iVar10 + -1, bVar12) {
      lVar6 = std::chrono::_V2::system_clock::now();
      puVar2 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar7 = vbytehuffzero::encode
                        (puVar2,(long)(pvVar9->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >>
                                2,encoded_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                         (long)encoded_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)encoded_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                         tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      lVar8 = std::chrono::_V2::system_clock::now();
      if ((ulong)(lVar8 - lVar6) <= uVar11) {
        uVar11 = lVar8 - lVar6;
      }
    }
    auVar3 = vcvtusi2sd_avx512f(in_XMM2,uVar11);
    auVar4 = vcvtusi2sd_avx512f(in_XMM2,(long)(pvVar9->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pvVar9->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data._M_start >> 2);
    encode_IPS = auVar4._0_8_ / (auVar3._0_8_ / 1000000000.0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &encoded_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,sVar7
              );
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&recover,(long)(pvVar9->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar9->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 2,
               (allocator_type *)&decode_IPS);
    iVar10 = 5;
    uVar11 = 0xffffffffffffffff;
    while (b = recover.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start, bVar12 = iVar10 != 0, iVar10 = iVar10 + -1, bVar12)
    {
      lVar6 = std::chrono::_V2::system_clock::now();
      vbytehuffzero::decode
                (encoded_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (long)encoded_data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)encoded_data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                 recover.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (long)recover.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)recover.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2,
                 tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      lVar8 = std::chrono::_V2::system_clock::now();
      if ((ulong)(lVar8 - lVar6) <= uVar11) {
        uVar11 = lVar8 - lVar6;
      }
    }
    auVar3 = vcvtusi2sd_avx512f(in_XMM2,uVar11);
    puVar2 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar7 = (long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
    auVar4 = vcvtusi2sd_avx512f(in_XMM2,sVar7);
    decode_IPS = auVar4._0_8_ / (auVar3._0_8_ / 1000000000.0);
    vbytehuffzero::name_abi_cxx11_();
    REQUIRE_EQUAL(puVar2,b,sVar7,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::vector<double,_std::allocator<double>_>::push_back(&enc_speed,&encode_IPS);
    std::vector<double,_std::allocator<double>_>::push_back
              (&dec_speed,(value_type_conflict6 *)&decode_IPS);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&recover.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&encoded_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  lVar6 = 0;
  uVar11 = 0;
  while (lVar8 = lVar6,
        uVar11 < (ulong)((long)enc_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)enc_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start >> 3)) {
    while (bVar12 = lVar8 != 0, lVar8 = lVar8 + -1, bVar12) {
      putchar(0x20);
    }
    printf("%15.4f  &  %15.4f  ",
           enc_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11],
           dec_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11]);
    uVar11 = uVar11 + 1;
    __s = "&";
    if (uVar11 == (long)enc_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)enc_speed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) {
      __s = "\\\\ \n";
    }
    puts(__s);
    lVar6 = lVar6 + 4;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dec_speed.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&enc_speed.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void run(std::vector<std::vector<uint32_t>>& inputs)
{
    std::cout << "\\method{" << t_compressor::name() << "}  &" << std::endl;

    std::vector<double> enc_speed;
    std::vector<double> dec_speed;
    for (const auto& input : inputs) {
        // (1) encode
        std::vector<uint8_t> encoded_data(input.size() * 8);
        std::vector<uint8_t> tmp_buf(input.size() * 8);

        size_t encoded_bytes = 0;
        size_t encoding_time_ns_min = std::numeric_limits<size_t>::max();
        for (int i = 0; i < NUM_RUNS; i++) {
            auto start_encode = std::chrono::high_resolution_clock::now();
            encoded_bytes = t_compressor::encode(input.data(), input.size(),
                encoded_data.data(), encoded_data.size(), tmp_buf.data());
            auto stop_encode = std::chrono::high_resolution_clock::now();
            auto encoding_time_ns = stop_encode - start_encode;
            encoding_time_ns_min = std::min(
                (size_t)encoding_time_ns.count(), encoding_time_ns_min);
        }
        double encode_IPS = compute_ips(input.size(), encoding_time_ns_min);

        // (2) decode
        encoded_data.resize(encoded_bytes);
        std::vector<uint32_t> recover(input.size());
        size_t decode_time_ns_min = std::numeric_limits<size_t>::max();
        for (int i = 0; i < NUM_RUNS; i++) {
            auto start_decode = std::chrono::high_resolution_clock::now();
            t_compressor::decode(encoded_data.data(), encoded_data.size(),
                recover.data(), recover.size(), tmp_buf.data());
            auto stop_decode = std::chrono::high_resolution_clock::now();
            auto decode_time_ns = stop_decode - start_decode;
            decode_time_ns_min
                = std::min((size_t)decode_time_ns.count(), decode_time_ns_min);
        }
        double decode_IPS = compute_ips(input.size(), decode_time_ns_min);

        // (3) verify
        REQUIRE_EQUAL(
            input.data(), recover.data(), input.size(), t_compressor::name());

        enc_speed.push_back(encode_IPS);
        dec_speed.push_back(decode_IPS);
    }

    for (size_t i = 0; i < enc_speed.size(); i++) {
        for (size_t j = 0; j < i * 4; j++)
            printf(" ");
        printf("%15.4f  &  %15.4f  ", enc_speed[i], dec_speed[i]);
        if (i + 1 == enc_speed.size())
            printf("\\\\ \n\n");
        else
            printf("&\n");
    }
}